

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

int __thiscall File::copy(File *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int __fd;
  int __out_fd;
  char *pcVar1;
  size_t __count;
  __off_t _Var2;
  size_t sVar3;
  uint uVar4;
  
  pcVar1 = String::operator_cast_to_char_((String *)this);
  uVar4 = 0;
  __fd = ::open(pcVar1,0);
  if (__fd != -1) {
    uVar4 = 0;
    __count = lseek(__fd,0,2);
    if (-1 < (long)__count) {
      uVar4 = 0;
      _Var2 = lseek(__fd,0,0);
      if (-1 < _Var2) {
        pcVar1 = String::operator_cast_to_char_((String *)dst);
        uVar4 = 0;
        __out_fd = ::open(pcVar1,((uint)src & 0xff) << 7 | 0x80241,0x1a4);
        if (__out_fd != -1) {
          sVar3 = sendfile(__out_fd,__fd,(off_t *)0x0,__count);
          uVar4 = (uint)(sVar3 == __count);
          ::close(__fd);
          __fd = __out_fd;
        }
        ::close(__fd);
      }
    }
  }
  return uVar4;
}

Assistant:

bool File::copy(const String& src, const String& destination, bool failIfExists)
{
#ifdef _WIN32
  return CopyFile(src, destination, failIfExists) == TRUE;
#else
    int fd = ::open(src, O_RDONLY);
    if(fd == -1)
      return false;
    off64_t size = lseek(fd, 0, SEEK_END);
    if(size < 0)
      return false;
    if(lseek(fd, 0, SEEK_SET) < 0)
      return false;
    int dest = ::open(destination, failIfExists ? (O_CREAT | O_EXCL | O_CLOEXEC | O_TRUNC | O_WRONLY) : (O_CREAT | O_CLOEXEC | O_TRUNC | O_WRONLY), S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if(dest == -1)
    {
      ::close(fd);
      return false;
    }
    if(sendfile(dest, fd, 0, size) != size)
    {
      ::close(fd);
      ::close(dest);
      return false;
    }
    ::close(fd);
    ::close(dest);
    return true;
#endif
}